

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O3

bool __thiscall
node::BlockAssembler::TestPackageTransactions(BlockAssembler *this,setEntries *package)

{
  long lVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (package->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(package->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = IsFinalTx((CTransaction *)**(undefined8 **)(p_Var3 + 1),this->nHeight,
                        this->m_lock_time_cutoff);
      if (!bVar2) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BlockAssembler::TestPackageTransactions(const CTxMemPool::setEntries& package) const
{
    for (CTxMemPool::txiter it : package) {
        if (!IsFinalTx(it->GetTx(), nHeight, m_lock_time_cutoff)) {
            return false;
        }
    }
    return true;
}